

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RJson.h
# Opt level: O2

RValue * __thiscall RJson::RDocument::last(RValue *__return_storage_ptr__,RDocument *this)

{
  ValueIterator pGVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar2;
  
  if ((this->_doc).
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      .data_.f.flags == 4) {
    pGVar1 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)this);
    pMVar2 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(&this->_doc);
    __return_storage_ptr__->_allocator = pMVar2;
    __return_storage_ptr__->_value = pGVar1 + -1;
    __return_storage_ptr__->_own = false;
  }
  else {
    puts("RDocument is not an array, can not last!");
    GenericRValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::GenericRValue
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

RValue last() {
        if (!_doc.IsArray()) {
            printf("RDocument is not an array, can not last!\n");
            return {};
        }

        auto iter = _doc.End()-1;
        return RValue(&(*iter), &_doc.GetAllocator());
    }